

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_vector.h
# Opt level: O0

bool __thiscall spvtools::utils::BitVector::Set(BitVector *this,uint32_t i)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  ulong uVar4;
  bool bVar5;
  BitContainer ith_bit;
  BitContainer original;
  uint local_24;
  uint local_20;
  uint32_t bit_in_element;
  uint32_t element_index;
  uint32_t i_local;
  BitVector *this_local;
  
  local_20 = i >> 6;
  local_24 = i & 0x3f;
  uVar1 = (ulong)local_20;
  bit_in_element = i;
  _element_index = this;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->bits_);
  if (sVar2 <= uVar1) {
    original = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->bits_,(ulong)(local_20 + 1),&original);
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->bits_,(ulong)local_20);
  uVar1 = *pvVar3;
  uVar4 = 1L << ((byte)local_24 & 0x3f);
  bVar5 = (uVar1 & uVar4) == 0;
  if (bVar5) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->bits_,(ulong)local_20);
    *pvVar3 = uVar1 | uVar4;
  }
  this_local._7_1_ = !bVar5;
  return this_local._7_1_;
}

Assistant:

bool Set(uint32_t i) {
    uint32_t element_index = i / kBitContainerSize;
    uint32_t bit_in_element = i % kBitContainerSize;

    if (element_index >= bits_.size()) {
      bits_.resize(element_index + 1, 0);
    }

    BitContainer original = bits_[element_index];
    BitContainer ith_bit = static_cast<BitContainer>(1) << bit_in_element;

    if ((original & ith_bit) != 0) {
      return true;
    } else {
      bits_[element_index] = original | ith_bit;
      return false;
    }
  }